

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# singledocparser.cpp
# Opt level: O2

void __thiscall
YAML::SingleDocParser::SingleDocParser
          (SingleDocParser *this,Scanner *scanner,Directives *directives)

{
  _Rb_tree_header *p_Var1;
  stack<YAML::CollectionType::value,_std::deque<YAML::CollectionType::value,_std::allocator<YAML::CollectionType::value>_>_>
  *this_00;
  
  this->depth = 0;
  this->m_scanner = scanner;
  this->m_directives = directives;
  this_00 = (stack<YAML::CollectionType::value,_std::deque<YAML::CollectionType::value,_std::allocator<YAML::CollectionType::value>_>_>
             *)operator_new(0x50);
  std::
  stack<YAML::CollectionType::value,std::deque<YAML::CollectionType::value,std::allocator<YAML::CollectionType::value>>>
  ::stack<std::deque<YAML::CollectionType::value,std::allocator<YAML::CollectionType::value>>,void>
            (this_00);
  (this->m_pCollectionStack)._M_t.
  super___uniq_ptr_impl<YAML::CollectionStack,_std::default_delete<YAML::CollectionStack>_>._M_t.
  super__Tuple_impl<0UL,_YAML::CollectionStack_*,_std::default_delete<YAML::CollectionStack>_>.
  super__Head_base<0UL,_YAML::CollectionStack_*,_false>._M_head_impl = (CollectionStack *)this_00;
  p_Var1 = &(this->m_anchors)._M_t._M_impl.super__Rb_tree_header;
  (this->m_anchors)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  *(undefined8 *)&(this->m_anchors)._M_t._M_impl = 0;
  *(undefined8 *)&(this->m_anchors)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  (this->m_anchors)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_anchors)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_anchors)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->m_curAnchor = 0;
  return;
}

Assistant:

SingleDocParser::SingleDocParser(Scanner& scanner, const Directives& directives)
    : m_scanner(scanner),
      m_directives(directives),
      m_pCollectionStack(new CollectionStack),
      m_anchors{},
      m_curAnchor(0) {}